

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O0

int ps_activate_search(ps_decoder_t *ps,char *name)

{
  int iVar1;
  ps_search_t *ppVar2;
  long lVar3;
  ps_search_t *search;
  char *name_local;
  ps_decoder_t *ps_local;
  
  if ((ps->acmod->state == '\x03') || (ps->acmod->state == '\0')) {
    search = (ps_search_t *)name;
    if (name == (char *)0x0) {
      search = (ps_search_t *)anon_var_dwarf_2dd3;
    }
    ppVar2 = ps_find_search(ps,(char *)search);
    if (ppVar2 == (ps_search_t *)0x0) {
      ps_local._4_4_ = -1;
    }
    else {
      ps->search = ppVar2;
      iVar1 = strcmp("ngram",ppVar2->type);
      if (iVar1 == 0) {
        lVar3 = ps_config_int(ps->config,"pl_window");
        ps->pl_window = (int)lVar3;
      }
      else {
        ps->pl_window = 0;
      }
      ps_local._4_4_ = 0;
    }
  }
  else {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
            ,0x1f7,"Cannot change search while decoding, end utterance first\n");
    ps_local._4_4_ = -1;
  }
  return ps_local._4_4_;
}

Assistant:

int
ps_activate_search(ps_decoder_t *ps, const char *name)
{
    ps_search_t *search;

    if (ps->acmod->state != ACMOD_ENDED && ps->acmod->state != ACMOD_IDLE) {
        E_ERROR("Cannot change search while decoding, end utterance first\n");
        return -1;
    }

    if (name == NULL)
        name = PS_DEFAULT_SEARCH;

    if (!(search = ps_find_search(ps, name)))
        return -1;

    ps->search = search;
    /* Set pl window depending on the search */
    if (!strcmp(PS_SEARCH_TYPE_NGRAM, ps_search_type(search))) {
        ps->pl_window = ps_config_int(ps->config, "pl_window");
    } else {
        ps->pl_window = 0;
    }

    return 0;
}